

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hybrid_36_c.c
# Opt level: O0

void encode_pure(char *digits,uint digits_size,uint width,int value,char *result)

{
  undefined8 uVar1;
  uint uVar2;
  uint uVar3;
  uint local_44;
  uint local_40;
  uint j;
  uint i;
  int rest;
  char buf [16];
  char *result_local;
  int value_local;
  uint width_local;
  uint digits_size_local;
  char *digits_local;
  
  buf._8_8_ = result;
  local_40 = 0;
  uVar3 = local_40;
  result_local._4_4_ = value;
  if (value < 0) {
    result_local._4_4_ = -value;
  }
  do {
    local_40 = uVar3;
    uVar2 = result_local._4_4_ / digits_size;
    uVar3 = local_40 + 1;
    *(char *)((long)&i + (ulong)local_40) = digits[result_local._4_4_ - uVar2 * digits_size];
    result_local._4_4_ = uVar2;
  } while (uVar2 != 0);
  if (value < 0) {
    *(undefined1 *)((long)&i + (ulong)uVar3) = 0x2d;
    uVar3 = local_40 + 2;
  }
  local_40 = uVar3;
  for (local_44 = local_40; uVar1 = buf._8_8_, local_44 < width; local_44 = local_44 + 1) {
    buf._8_8_ = buf._8_8_ + 1;
    *(undefined1 *)uVar1 = 0x20;
  }
  while (uVar1 = buf._8_8_, local_40 != 0) {
    local_40 = local_40 - 1;
    buf._8_8_ = buf._8_8_ + 1;
    *(undefined1 *)uVar1 = *(undefined1 *)((long)&i + (ulong)local_40);
  }
  *(undefined1 *)buf._8_8_ = 0;
  return;
}

Assistant:

static
void
encode_pure(
  const char* digits,
  unsigned digits_size,
  unsigned width,
  int value,
  char* result)
{
  char buf[16];
  int rest;
  unsigned i, j;
  i = 0;
  j = 0;
  if (value < 0) {
    j = 1;
    value = -value;
  }
  while (1) {
    rest = value / digits_size;
    buf[i++] = digits[value - rest * digits_size];
    if (rest == 0) break;
    value = rest;
  }
  if (j) buf[i++] = '-';
  for(j=i;j<width;j++) *result++ = ' ';
  while (i != 0) *result++ = buf[--i];
  *result = '\0';
}